

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void redraw_game_windows(void)

{
  int local_6c;
  int local_5c;
  int local_4c;
  int local_3c;
  int local_2c;
  int local_1c;
  gamewin *local_10;
  gamewin *gw;
  
  if (basewin == (WINDOW_conflict *)0x0) {
    local_1c = -1;
  }
  else {
    local_1c = basewin->_maxy + 1;
  }
  wredrawln(basewin,0,local_1c);
  wnoutrefresh(basewin);
  if (ui_flags.ingame != '\0') {
    if (mapwin == (WINDOW_conflict *)0x0) {
      local_2c = -1;
    }
    else {
      local_2c = mapwin->_maxy + 1;
    }
    wredrawln(mapwin,0,local_2c);
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_3c = -1;
    }
    else {
      local_3c = msgwin->_maxy + 1;
    }
    wredrawln(msgwin,0,local_3c);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW_conflict *)0x0) {
      if (statuswin == (WINDOW_conflict *)0x0) {
        local_4c = -1;
      }
      else {
        local_4c = statuswin->_maxy + 1;
      }
      wredrawln(statuswin,0,local_4c);
      wnoutrefresh(statuswin);
    }
    if (sidebar != (WINDOW_conflict *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW_conflict *)0x0) {
        local_5c = -1;
      }
      else {
        local_5c = sidebar->_maxy + 1;
      }
      wredrawln(sidebar,0,local_5c);
      wnoutrefresh(sidebar);
    }
    draw_frame();
  }
  for (local_10 = firstgw; local_10 != (gamewin *)0x0; local_10 = local_10->next) {
    (*local_10->draw)(local_10);
    if (local_10->win == (WINDOW_conflict *)0x0) {
      local_6c = -1;
    }
    else {
      local_6c = local_10->win->_maxy + 1;
    }
    wredrawln(local_10->win,0,local_6c);
    wnoutrefresh(local_10->win);
  }
  return;
}

Assistant:

void redraw_game_windows(void)
{
    struct gamewin *gw;
    
    redrawwin(basewin);
    wnoutrefresh(basewin);
    
    if (ui_flags.ingame) {
	redrawwin(mapwin);
	redrawwin(msgwin);
	
	wnoutrefresh(mapwin);
	wnoutrefresh(msgwin);
	
	/* statuswin can become NULL if the terminal is resized to microscopic dimensions */
	if (statuswin) {
	    redrawwin(statuswin);
	    wnoutrefresh(statuswin);
	}
	
	if (sidebar) {
	    draw_sidebar_divider();
	    redrawwin(sidebar);
	    wnoutrefresh(sidebar);
	}
	
	draw_frame();
    }
    
    for (gw = firstgw; gw; gw = gw->next) {
	gw->draw(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }
}